

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall
leveldb::VersionSet::GetRange
          (VersionSet *this,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs,
          InternalKey *smallest,InternalKey *largest)

{
  pointer ppFVar1;
  FileMetaData *pFVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  
  if ((inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("!inputs.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x4a0,
                  "void leveldb::VersionSet::GetRange(const std::vector<FileMetaData *> &, InternalKey *, InternalKey *)"
                 );
  }
  (smallest->rep_)._M_string_length = 0;
  uVar4 = 0;
  *(smallest->rep_)._M_dataplus._M_p = '\0';
  (largest->rep_)._M_string_length = 0;
  *(largest->rep_)._M_dataplus._M_p = '\0';
  do {
    ppFVar1 = (inputs->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(inputs->
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <= uVar4) {
      return;
    }
    pFVar2 = ppFVar1[uVar4];
    if (uVar4 == 0) {
      std::__cxx11::string::_M_assign((string *)smallest);
LAB_001380be:
      std::__cxx11::string::_M_assign((string *)largest);
    }
    else {
      iVar3 = InternalKeyComparator::Compare(&this->icmp_,&pFVar2->smallest,smallest);
      if (iVar3 < 0) {
        std::__cxx11::string::_M_assign((string *)smallest);
      }
      iVar3 = InternalKeyComparator::Compare(&this->icmp_,&pFVar2->largest,largest);
      if (0 < iVar3) goto LAB_001380be;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void VersionSet::Finalize(Version* v) {
  // Precomputed best level for next compaction
  int best_level = -1;
  double best_score = -1;

  for (int level = 0; level < config::kNumLevels - 1; level++) {
    double score;
    if (level == 0) {
      // We treat level-0 specially by bounding the number of files
      // instead of number of bytes for two reasons:
      //
      // (1) With larger write-buffer sizes, it is nice not to do too
      // many level-0 compactions.
      //
      // (2) The files in level-0 are merged on every read and
      // therefore we wish to avoid too many files when the individual
      // file size is small (perhaps because of a small write-buffer
      // setting, or very high compression ratios, or lots of
      // overwrites/deletions).
      score = v->files_[level].size() /
              static_cast<double>(config::kL0_CompactionTrigger);
    } else {
      // Compute the ratio of current size to size limit.
      const uint64_t level_bytes = TotalFileSize(v->files_[level]);
      score =
          static_cast<double>(level_bytes) / MaxBytesForLevel(options_, level);
    }

    if (score > best_score) {
      best_level = level;
      best_score = score;
    }
  }

  v->compaction_level_ = best_level;
  v->compaction_score_ = best_score;
}